

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:657:56)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:657:56)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  uint32_t uVar2;
  long *plVar3;
  undefined8 *puVar4;
  global_object *this_00;
  object *poVar5;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  value *v;
  undefined8 extraout_RDX_00;
  value *v_00;
  long lVar7;
  pointer pvVar8;
  value *rhs;
  uint uVar9;
  _Alloc_hider this_01;
  initializer_list<mjs::value> __l;
  initializer_list<mjs::value> __l_00;
  bool some;
  allocator_type local_1b9;
  string *local_1b8;
  object_ptr o;
  wstring is;
  anon_class_8_1_8991a1f2 local_180;
  gc_heap_ptr_untyped local_178;
  value *local_168;
  undefined1 local_160 [40];
  undefined4 local_138;
  double local_130;
  value local_110;
  value callback;
  vector<mjs::value,_std::allocator<mjs::value>_> local_c0;
  value res;
  value kval;
  value this_arg;
  
  some = false;
  local_168 = __return_storage_ptr__;
  gc_heap_ptr_untyped::gc_heap_ptr_untyped(&local_178,(gc_heap_ptr_untyped *)&this->f);
  local_180.some = &some;
  plVar3 = (long *)gc_heap_ptr_untyped::get(&local_178);
  (**(code **)(*plVar3 + 0x88))(&o,plVar3,this_);
  puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
  callback.type_ = reference;
  callback._4_4_ = 0;
  callback.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x17cf74;
  (**(code **)*puVar4)(local_160,puVar4);
  uVar2 = to_uint32((value *)local_160);
  local_1b8 = (string *)CONCAT44(local_1b8._4_4_,uVar2);
  value::~value((value *)local_160);
  pvVar8 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar8 == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    pvVar8 = (pointer)&value::undefined;
  }
  value::value(&callback,pvVar8);
  this_00 = (global_object *)gc_heap_ptr_untyped::get(&local_178);
  plVar3 = (long *)gc_heap_ptr_untyped::get(&local_178);
  (**(code **)(*plVar3 + 0x60))(local_160,plVar3);
  global_object::validate_type(this_00,&callback,(object_ptr *)local_160,"function");
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_160);
  pvVar8 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pvVar8) / 0x28) < 2) {
    rhs = (value *)&value::undefined;
  }
  else {
    rhs = pvVar8 + 1;
  }
  value::value(&this_arg,rhs);
  if ((uint)local_1b8 < 0x10000) {
    uVar6 = extraout_RDX;
    for (uVar9 = 0; uVar9 != (uint)local_1b8; uVar9 = uVar9 + 1) {
      index_string_abi_cxx11_(&is,(mjs *)(ulong)uVar9,(uint32_t)uVar6);
      poVar5 = (object *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
      local_160._8_8_ = is._M_dataplus._M_p;
      local_160._0_8_ = is._M_string_length;
      bVar1 = object::has_property(poVar5,(wstring_view *)local_160);
      if (bVar1) {
        puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
        local_160._8_8_ = is._M_dataplus._M_p;
        local_160._0_8_ = is._M_string_length;
        (**(code **)*puVar4)(&kval,puVar4,(value *)local_160);
        value::value((value *)local_160,&kval);
        local_130 = (double)(int)uVar9;
        local_138 = 3;
        value::value(&local_110,&o);
        __l._M_len = 3;
        __l._M_array = (value *)local_160;
        std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_c0,__l,&local_1b9);
        call_function(&res,&callback,&this_arg,&local_c0);
        std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_c0);
        lVar7 = 0x50;
        do {
          value::~value((value *)(local_160 + lVar7));
          lVar7 = lVar7 + -0x28;
        } while (lVar7 != -0x28);
        bVar1 = anon_unknown_110::array_some::anon_class_8_1_8991a1f2::operator()
                          (&local_180,(uint32_t)&res,v);
        value::~value(&res);
        value::~value(&kval);
        if (!bVar1) {
          std::__cxx11::wstring::~wstring((wstring *)&is);
          break;
        }
      }
      std::__cxx11::wstring::~wstring((wstring *)&is);
      uVar6 = extraout_RDX_00;
    }
  }
  else {
    poVar5 = (object *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
    object::enumerable_property_names
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)&is,poVar5);
    local_1b8 = (string *)is._M_string_length;
    for (this_01 = is._M_dataplus; (string *)this_01._M_p != local_1b8;
        this_01._M_p = this_01._M_p + 0x10) {
      local_160._0_16_ = (undefined1  [16])string::view((string *)this_01._M_p);
      uVar2 = index_value_from_string((wstring_view *)local_160);
      if (uVar2 != 0xffffffff) {
        puVar4 = (undefined8 *)gc_heap_ptr_untyped::get(&o.super_gc_heap_ptr_untyped);
        local_160._0_16_ = (undefined1  [16])string::view((string *)this_01._M_p);
        (**(code **)*puVar4)(&kval,puVar4,(value *)local_160);
        value::value((value *)local_160,&kval);
        local_130 = (double)uVar2;
        local_138 = 3;
        value::value(&local_110,&o);
        __l_00._M_len = 3;
        __l_00._M_array = (value *)local_160;
        std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_c0,__l_00,&local_1b9);
        call_function(&res,&callback,&this_arg,&local_c0);
        std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_c0);
        lVar7 = 0x50;
        do {
          value::~value((value *)(local_160 + lVar7));
          lVar7 = lVar7 + -0x28;
        } while (lVar7 != -0x28);
        bVar1 = anon_unknown_110::array_some::anon_class_8_1_8991a1f2::operator()
                          (&local_180,(uint32_t)&res,v_00);
        value::~value(&res);
        value::~value(&kval);
        if (!bVar1) break;
      }
    }
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)&is);
  }
  value::~value(&this_arg);
  value::~value(&callback);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&o.super_gc_heap_ptr_untyped);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_178);
  local_168->type_ = boolean;
  (local_168->field_1).b_ = some;
  return local_168;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }